

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

char mpc_input_getc(mpc_input_t *i)

{
  char *__s;
  long lVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  
  iVar4 = i->type;
  if (iVar4 == 2) {
    __s = i->buffer;
    if (__s != (char *)0x0) {
      lVar1 = (i->state).pos;
      sVar5 = strlen(__s);
      lVar2 = i->marks->pos;
      if (lVar1 < (long)(sVar5 + lVar2)) {
        return __s[lVar1 - lVar2];
      }
    }
    iVar4 = getc((FILE *)i->file);
    cVar3 = (char)iVar4;
  }
  else if (iVar4 == 1) {
    iVar4 = fgetc((FILE *)i->file);
    cVar3 = (char)iVar4;
  }
  else if (iVar4 == 0) {
    cVar3 = i->string[(i->state).pos];
  }
  else {
    cVar3 = '\0';
  }
  return cVar3;
}

Assistant:

static char mpc_input_getc(mpc_input_t *i) {

  char c = '\0';

  switch (i->type) {

    case MPC_INPUT_STRING: return i->string[i->state.pos];
    case MPC_INPUT_FILE: c = fgetc(i->file); return c;
    case MPC_INPUT_PIPE:

      if (!i->buffer) { c = getc(i->file); return c; }

      if (i->buffer && mpc_input_buffer_in_range(i)) {
        c = mpc_input_buffer_get(i);
        return c;
      } else {
        c = getc(i->file);
        return c;
      }

    default: return c;
  }
}